

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int getdigit(sxlongreal *val,int *cnt)

{
  longdouble lVar1;
  int iVar2;
  int digit;
  sxlongreal d;
  int *cnt_local;
  sxlongreal *val_local;
  
  iVar2 = *cnt;
  *cnt = iVar2 + 1;
  if (iVar2 < 0x10) {
    lVar1 = *(longdouble *)val;
    *(longdouble *)val = (longdouble)10.0 * (*(longdouble *)val - (longdouble)(int)ROUND(lVar1));
    val_local._4_4_ = (int)ROUND(lVar1) + 0x30;
  }
  else {
    val_local._4_4_ = 0x30;
  }
  return val_local._4_4_;
}

Assistant:

static int getdigit(sxlongreal *val, int *cnt)
{
  sxlongreal d;
  int digit;

  if( (*cnt)++ >= 16 ){
	  return '0';
  }
  digit = (int)*val;
  d = digit;
   *val = (*val - d)*10.0;
  return digit + '0' ;
}